

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

int Pdr_SetCompare(Pdr_Set_t **pp1,Pdr_Set_t **pp2)

{
  uint uVar1;
  Pdr_Set_t *pPVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  pPVar2 = *pp2;
  uVar1 = (*pp1)->nLits;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  do {
    if (uVar4 == uVar5) {
LAB_004e6398:
      if ((((uint)uVar4 != uVar1) || (iVar3 = -1, pPVar2->nLits <= (int)uVar1)) &&
         (((long)(int)uVar1 <= (long)uVar5 || (iVar3 = 1, (uint)uVar4 != pPVar2->nLits)))) {
        iVar3 = 0;
      }
      return iVar3;
    }
    if ((long)pPVar2->nLits <= (long)uVar5) {
      uVar4 = uVar5 & 0xffffffff;
      goto LAB_004e6398;
    }
    iVar3 = *(int *)(&(*pp1)->field_0x14 + uVar5 * 4);
    if (*(int *)(&pPVar2->field_0x14 + uVar5 * 4) < iVar3) {
      return -1;
    }
    if (iVar3 < *(int *)(&pPVar2->field_0x14 + uVar5 * 4)) {
      return 1;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int Pdr_SetCompare( Pdr_Set_t ** pp1, Pdr_Set_t ** pp2 )
{
    Pdr_Set_t * p1 = *pp1;
    Pdr_Set_t * p2 = *pp2;
    int i;
    for ( i = 0; i < p1->nLits && i < p2->nLits; i++ )
    {
        if ( p1->Lits[i] > p2->Lits[i] )
            return -1;
        if ( p1->Lits[i] < p2->Lits[i] )
            return 1;
    }
    if ( i == p1->nLits && i < p2->nLits )
        return -1;
    if ( i < p1->nLits && i == p2->nLits )
        return 1;
    return 0;
}